

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryWriter::writeSourceMapUrl(WasmBinaryWriter *this)

{
  char *__str;
  string_view local_38;
  string_view local_28;
  int32_t local_14;
  WasmBinaryWriter *pWStack_10;
  int32_t start;
  WasmBinaryWriter *this_local;
  
  pWStack_10 = this;
  local_14 = startSection<wasm::BinaryConsts::Section>(this,Custom);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,BinaryConsts::CustomSections::SourceMapUrl);
  writeInlineString(this,local_28);
  __str = (char *)std::__cxx11::string::c_str();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,__str);
  writeInlineString(this,local_38);
  finishSection(this,local_14);
  return;
}

Assistant:

void WasmBinaryWriter::writeSourceMapUrl() {
  auto start = startSection(BinaryConsts::Section::Custom);
  writeInlineString(BinaryConsts::CustomSections::SourceMapUrl);
  writeInlineString(sourceMapUrl.c_str());
  finishSection(start);
}